

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O0

undefined8 gimage::(anonymous_namespace)::readPNMToken_abi_cxx11_(istream *in)

{
  byte bVar1;
  int iVar2;
  char *in_RSI;
  undefined8 in_RDI;
  bool bVar3;
  ostringstream s;
  char c;
  ostringstream local_190 [383];
  char local_11;
  char *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::istream::get(local_10);
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    while( true ) {
      bVar1 = std::ios::eof();
      bVar3 = false;
      if ((bVar1 & 1) == 0) {
        iVar2 = isspace((int)local_11);
        bVar3 = iVar2 != 0;
      }
      if (!bVar3) break;
      std::istream::get(local_10);
    }
    if (local_11 != '#') break;
    while( true ) {
      bVar1 = std::ios::eof();
      bVar3 = false;
      if (((bVar1 & 1) == 0) && (bVar3 = false, local_11 != '\n')) {
        bVar3 = local_11 != '\r';
      }
      if (!bVar3) break;
      std::istream::get(local_10);
    }
  }
  while( true ) {
    bVar1 = std::ios::eof();
    bVar3 = false;
    if ((bVar1 & 1) == 0) {
      iVar2 = isspace((int)local_11);
      bVar3 = false;
      if (iVar2 == 0) {
        bVar3 = local_11 != '#';
      }
    }
    if (!bVar3) break;
    std::operator<<((ostream *)local_190,local_11);
    std::istream::get(local_10);
  }
  bVar1 = std::ios::eof();
  if (((bVar1 & 1) == 0) && (local_11 == '#')) {
    std::istream::unget();
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string readPNMToken(std::istream &in)
{
  char c;
  std::ostringstream s;

  // read the first character of the token (ignoring white spaces and
  // comments in front the token)

  in.get(c);

  while (!in.eof())
  {
    while (!in.eof() && isspace(c))
    {
      in.get(c);
    }

    if (c == '#')
    {
      while (!in.eof() && c != '\n' && c != '\r')
      {
        in.get(c);
      }
    }
    else
    {
      break;
    }
  }

  // reading a token until white space or start of comment

  while (!in.eof() && !isspace(c) && c != '#')
  {
    s << c;
    in.get(c);
  }

  // put last character back if it was the start of a comment

  if (!in.eof() && c == '#')
  {
    in.unget();
  }

  return s.str();
}